

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImageList.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIImageList::~CGUIImageList(CGUIImageList *this)

{
  ~CGUIImageList(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

CGUIImageList::~CGUIImageList()
{
	if (Driver) {
		Driver->drop();
	}

	if (Texture) {
		Texture->drop();
	}
}